

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O0

BoxList * __thiscall amrex::BoxList::removeEmpty(BoxList *this)

{
  iterator iVar1;
  iterator __first;
  BoxList *in_RDI;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *in_stack_ffffffffffffffa8;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *in_stack_ffffffffffffffc8;
  const_iterator in_stack_ffffffffffffffd0;
  
  iVar1 = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin(in_stack_ffffffffffffffa8);
  __first = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end(in_stack_ffffffffffffffa8);
  std::
  remove_if<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,amrex::BoxList::removeEmpty()::__0>
            (iVar1._M_current,__first._M_current);
  __gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>
  ::__normal_iterator<amrex::Box*>
            ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
              *)in_RDI,
             (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
              *)in_stack_ffffffffffffffa8);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end(in_stack_ffffffffffffffa8);
  __gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>
  ::__normal_iterator<amrex::Box*>
            ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
              *)in_RDI,
             (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
              *)in_stack_ffffffffffffffa8);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::erase
            (in_stack_ffffffffffffffc8,(const_iterator)__first._M_current,in_stack_ffffffffffffffd0)
  ;
  return in_RDI;
}

Assistant:

BoxList&
BoxList::removeEmpty()
{
    m_lbox.erase(std::remove_if(m_lbox.begin(), m_lbox.end(),
                                [](const Box& x) { return x.isEmpty(); }),
                 m_lbox.end());
    return *this;
}